

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtree.c
# Opt level: O2

GTreeNode * g_tree_first_node(GTree *tree)

{
  GTreeNode *pGVar1;
  
  pGVar1 = tree->root;
  if (pGVar1 == (GTreeNode *)0x0) {
    pGVar1 = (GTreeNode *)0x0;
  }
  else {
    for (; pGVar1->left_child != '\0'; pGVar1 = pGVar1->left) {
    }
  }
  return pGVar1;
}

Assistant:

static inline GTreeNode *g_tree_first_node (GTree *tree)
{
    GTreeNode *tmp;

    if (!tree->root)
        return NULL;

    tmp = tree->root;

    while (tmp->left_child)
        tmp = tmp->left;

    return tmp;
}